

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

bool AI::areAdjacent(Task *a,Task *b)

{
  SatisfiablePredicateIdentifier SVar1;
  undefined4 uVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  undefined4 op;
  pointer pSVar7;
  pointer pSVar8;
  pointer pCVar9;
  bool bVar10;
  RequiredFlag *flag;
  pointer pRVar11;
  pointer pSVar12;
  __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
  _Var13;
  long lVar14;
  pointer pRVar15;
  pointer pRVar16;
  pointer pSVar17;
  pointer pRVar18;
  WorldStateIdentifier WVar19;
  long lVar20;
  pointer pCVar21;
  vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *__range1;
  difference_type __trip_count;
  long lVar22;
  bool bVar23;
  ConsumableFact vector;
  ConsumableFact value;
  ConsumableFact flag_1;
  
  pRVar3 = (b->postconditions).requiredFlags.
           super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar4 = (b->postconditions).requiredFlags.
           super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar14 = (long)pRVar4 - (long)pRVar3;
  for (pRVar11 = (a->preconditions).requiredFlags.
                 super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pRVar11 !=
      (a->preconditions).requiredFlags.
      super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
      super__Vector_impl_data._M_finish; pRVar11 = pRVar11 + 1) {
    pRVar18 = pRVar3;
    lVar22 = lVar14;
    for (lVar20 = lVar14 >> 5; WVar19 = (*pRVar11).id, 0 < lVar20; lVar20 = lVar20 + -1) {
      if (pRVar18->id == WVar19) goto LAB_00127851;
      if (pRVar18[1].id == WVar19) {
        pRVar18 = pRVar18 + 1;
        goto LAB_00127851;
      }
      if (pRVar18[2].id == WVar19) {
        pRVar18 = pRVar18 + 2;
        goto LAB_00127851;
      }
      if (pRVar18[3].id == WVar19) {
        pRVar18 = pRVar18 + 3;
        goto LAB_00127851;
      }
      pRVar18 = pRVar18 + 4;
      lVar22 = lVar22 + -0x20;
    }
    lVar22 = lVar22 >> 3;
    if (lVar22 == 1) {
LAB_00127838:
      if (pRVar18->id != WVar19) {
        pRVar18 = pRVar4;
      }
LAB_00127851:
      if ((pRVar18 != pRVar4) && (pRVar18->flag == (*pRVar11).flag)) {
        return true;
      }
    }
    else {
      if (lVar22 == 2) {
LAB_0012782f:
        if (pRVar18->id != WVar19) {
          pRVar18 = pRVar18 + 1;
          goto LAB_00127838;
        }
        goto LAB_00127851;
      }
      if (lVar22 == 3) {
        if (pRVar18->id != WVar19) {
          pRVar18 = pRVar18 + 1;
          goto LAB_0012782f;
        }
        goto LAB_00127851;
      }
    }
  }
  pRVar5 = (b->postconditions).requiredValues.
           super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar6 = (b->postconditions).requiredValues.
           super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar14 = (long)pRVar6 - (long)pRVar5;
  for (pRVar15 = (a->preconditions).requiredValues.
                 super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pRVar15 !=
      (a->preconditions).requiredValues.
      super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
      super__Vector_impl_data._M_finish; pRVar15 = pRVar15 + 1) {
    uVar2 = pRVar15->id;
    op = pRVar15->op;
    lVar20 = lVar14;
    pRVar16 = pRVar5;
    for (lVar22 = lVar14 / 0xc >> 2; 0 < lVar22; lVar22 = lVar22 + -1) {
      if (pRVar16->id == uVar2) goto LAB_00127918;
      if (pRVar16[1].id == uVar2) {
        pRVar16 = pRVar16 + 1;
        goto LAB_00127918;
      }
      if (pRVar16[2].id == uVar2) {
        pRVar16 = pRVar16 + 2;
        goto LAB_00127918;
      }
      if (pRVar16[3].id == uVar2) {
        pRVar16 = pRVar16 + 3;
        goto LAB_00127918;
      }
      pRVar16 = pRVar16 + 4;
      lVar20 = lVar20 + -0x30;
    }
    lVar20 = lVar20 / 0xc;
    if (lVar20 == 1) {
LAB_001278ff:
      if (pRVar16->id != uVar2) {
        pRVar16 = pRVar6;
      }
LAB_00127918:
      if (pRVar16 != pRVar6) {
        switch(pRVar16->op) {
        case LessThan:
          bVar10 = canLessThanSatisfy(pRVar16->value,op,pRVar15->value);
          return bVar10;
        case LessEqual:
          bVar10 = canLessEqualSatisfy(pRVar16->value,op,pRVar15->value);
          return bVar10;
        case EqualTo:
          bVar10 = canEqualToSatisfy(pRVar16->value,op,pRVar15->value);
          return bVar10;
        case NotEqualTo:
          bVar10 = canNotEqualToSatisfy(pRVar16->value,op,pRVar15->value);
          return bVar10;
        case GreaterThan:
          bVar10 = canGreaterThanSatisfy(pRVar16->value,op,pRVar15->value);
          return bVar10;
        case GreaterEqual:
          bVar10 = canGreaterEqualSatisfy(pRVar16->value,op,pRVar15->value);
          return bVar10;
        }
      }
    }
    else {
      if (lVar20 == 2) {
LAB_001278f6:
        if (pRVar16->id != uVar2) {
          pRVar16 = pRVar16 + 1;
          goto LAB_001278ff;
        }
        goto LAB_00127918;
      }
      if (lVar20 == 3) {
        if (pRVar16->id != uVar2) {
          pRVar16 = pRVar16 + 1;
          goto LAB_001278f6;
        }
        goto LAB_00127918;
      }
    }
  }
  pSVar12 = (a->preconditions).satisfiedPredicates.
            super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar7 = (b->postconditions).satisfiedPredicates.
           super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar8 = (b->postconditions).satisfiedPredicates.
           super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar14 = (long)pSVar8 - (long)pSVar7;
  do {
    if (pSVar12 ==
        (a->preconditions).satisfiedPredicates.
        super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar21 = (a->preconditions).consumableFlags.
                super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar9 = (a->preconditions).consumableFlags.
               super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while (pCVar21 != pCVar9) {
        flag_1 = *pCVar21;
        _Var13 = std::
                 __find_if<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,__gnu_cxx::__ops::_Iter_equals_val<ConsumableFact_const>>
                           ((b->postconditions).consumableFlags.
                            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (b->postconditions).consumableFlags.
                            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                            _M_impl.super__Vector_impl_data._M_finish,&flag_1);
        pCVar21 = pCVar21 + 1;
        if (_Var13._M_current !=
            (b->postconditions).consumableFlags.
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          return true;
        }
      }
      pCVar21 = (a->preconditions).consumableValues.
                super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar9 = (a->preconditions).consumableValues.
               super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (pCVar21 == pCVar9) {
          pCVar21 = (a->preconditions).consumableVectors.
                    super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar9 = (a->preconditions).consumableVectors.
                   super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          do {
            bVar23 = pCVar21 == pCVar9;
            bVar10 = !bVar23;
            if (bVar23) {
              return bVar10;
            }
            vector = *pCVar21;
            _Var13 = std::
                     __find_if<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,__gnu_cxx::__ops::_Iter_equals_val<ConsumableFact_const>>
                               ((b->postconditions).consumableVectors.
                                super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (b->postconditions).consumableVectors.
                                super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                                _M_impl.super__Vector_impl_data._M_finish,&vector);
            pCVar21 = pCVar21 + 1;
          } while (_Var13._M_current ==
                   (b->postconditions).consumableVectors.
                   super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
                   super__Vector_impl_data._M_finish);
          return bVar10;
        }
        value = *pCVar21;
        _Var13 = std::
                 __find_if<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,__gnu_cxx::__ops::_Iter_equals_val<ConsumableFact_const>>
                           ((b->postconditions).consumableValues.
                            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (b->postconditions).consumableValues.
                            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
                            _M_impl.super__Vector_impl_data._M_finish,&value);
        pCVar21 = pCVar21 + 1;
      } while (_Var13._M_current ==
               (b->postconditions).consumableValues.
               super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
               super__Vector_impl_data._M_finish);
      return true;
    }
    SVar1 = pSVar12->identifier;
    pSVar17 = pSVar7;
    lVar20 = lVar14;
    for (lVar22 = lVar14 >> 5; 0 < lVar22; lVar22 = lVar22 + -1) {
      if (pSVar17->identifier == SVar1) goto LAB_00127a05;
      if (pSVar17[1].identifier == SVar1) {
        pSVar17 = pSVar17 + 1;
        goto LAB_00127a05;
      }
      if (pSVar17[2].identifier == SVar1) {
        pSVar17 = pSVar17 + 2;
        goto LAB_00127a05;
      }
      if (pSVar17[3].identifier == SVar1) {
        pSVar17 = pSVar17 + 3;
        goto LAB_00127a05;
      }
      pSVar17 = pSVar17 + 4;
      lVar20 = lVar20 + -0x20;
    }
    lVar20 = lVar20 >> 3;
    if (lVar20 == 1) {
LAB_001279ec:
      if (pSVar17->identifier != SVar1) {
        pSVar17 = pSVar8;
      }
LAB_00127a05:
      if (pSVar17 != pSVar8) {
        return true;
      }
    }
    else {
      if (lVar20 == 2) {
LAB_001279e3:
        if (pSVar17->identifier != SVar1) {
          pSVar17 = pSVar17 + 1;
          goto LAB_001279ec;
        }
        goto LAB_00127a05;
      }
      if (lVar20 == 3) {
        if (pSVar17->identifier != SVar1) {
          pSVar17 = pSVar17 + 1;
          goto LAB_001279e3;
        }
        goto LAB_00127a05;
      }
    }
    pSVar12 = pSVar12 + 1;
  } while( true );
}

Assistant:

bool areAdjacent(Task& a, Task& b)
	{
		auto& precondition = a.preconditions;		

		for (auto& flag : precondition.requiredFlags)
		{
			const auto& matchingFlag = std::find_if(begin(b.postconditions.requiredFlags), end(b.postconditions.requiredFlags),
				[flag](auto& f) {return f.id == flag.id;});

			if (matchingFlag != end(b.postconditions.requiredFlags))
			{
				if (flag.flag == matchingFlag->flag)
				{
					return true;
				}
			}
		}

		for (auto& value : precondition.requiredValues)
		{
			const auto& matchingValue = std::find_if(begin(b.postconditions.requiredValues), end(b.postconditions.requiredValues),
				[value](auto& v){return v.id == value.id;});

			if (matchingValue != end(b.postconditions.requiredValues))
			{
				switch(matchingValue->op)
				{
					case ConditionOp::LessThan
						:
					{
						return canLessThanSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::GreaterThan
						:
					{
						return canGreaterThanSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::EqualTo
						:
					{
						return canEqualToSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::NotEqualTo
						:
					{
						return canNotEqualToSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::LessEqual
						:
					{
						return canLessEqualSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::GreaterEqual
						:
					{
						return canGreaterEqualSatisfy(matchingValue->value, value.op, value.value);
					}
				}
			}
		}

		for (auto satisfiedPredicate : precondition.satisfiedPredicates)
		{
			const auto& it = std::find_if(begin(b.postconditions.satisfiedPredicates), end(b.postconditions.satisfiedPredicates),
				[satisfiedPredicate](auto& sp){return sp.identifier == satisfiedPredicate.identifier;});	
			
			if (it != end(b.postconditions.satisfiedPredicates))
			{
				return true;
			}
		}

		for (auto flag : precondition.consumableFlags)
		{
			if (std::find(begin(b.postconditions.consumableFlags), end(b.postconditions.consumableFlags), flag)
				!= end(b.postconditions.consumableFlags))
			{
				return true;
			}
		}

		for (auto value : precondition.consumableValues)
		{
			if (std::find(begin(b.postconditions.consumableValues), end(b.postconditions.consumableValues), value)
				!= end(b.postconditions.consumableValues))
			{
				return true;
			}
		}

		for (auto vector : precondition.consumableVectors)
		{
			if (std::find(begin(b.postconditions.consumableVectors), end(b.postconditions.consumableVectors), vector)
				!= end(b.postconditions.consumableVectors))
			{
				return true;
			}
		}

		return false;
	}